

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::DebugAnnotation_NestedValue::Serialize
          (DebugAnnotation_NestedValue *this,Message *msg)

{
  bool bVar1;
  reference str;
  reference pDVar2;
  Message *pMVar3;
  void *data;
  size_t size;
  DebugAnnotation_NestedValue *it_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
  *__range2_2;
  DebugAnnotation_NestedValue *it_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
  *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Message *msg_local;
  DebugAnnotation_NestedValue *this_local;
  
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::DebugAnnotation_NestedValue_NestedType>
              (msg,1,this->nested_type_);
  }
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->dict_keys_);
  it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->dict_keys_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&it), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
    protozero::Message::AppendString(msg,2,str);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
             ::begin(&this->dict_values_);
  it_1 = (DebugAnnotation_NestedValue *)
         std::
         vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
         ::end(&this->dict_values_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>_>
                             *)&it_1), bVar1) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>_>
             ::operator*(&__end2_1);
    pMVar3 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,3);
    Serialize(pDVar2,pMVar3);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
             ::begin(&this->array_values_);
  it_2 = (DebugAnnotation_NestedValue *)
         std::
         vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>
         ::end(&this->array_values_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<const_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>_>
                             *)&it_2), bVar1) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>_>
             ::operator*(&__end2_2);
    pMVar3 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,4);
    Serialize(pDVar2,pMVar3);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::DebugAnnotation_NestedValue_*,_std::vector<perfetto::protos::gen::DebugAnnotation_NestedValue,_std::allocator<perfetto::protos::gen::DebugAnnotation_NestedValue>_>_>
    ::operator++(&__end2_2);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<long>(msg,5,this->int_value_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendFixed<double>(msg,6,this->double_value_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,7);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,7,(uint)(this->bool_value_ & 1));
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,8);
  if (bVar1) {
    protozero::Message::AppendString(msg,8,&this->string_value_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void DebugAnnotation_NestedValue::Serialize(::protozero::Message* msg) const {
  // Field 1: nested_type
  if (_has_field_[1]) {
    msg->AppendVarInt(1, nested_type_);
  }

  // Field 2: dict_keys
  for (auto& it : dict_keys_) {
    msg->AppendString(2, it);
  }

  // Field 3: dict_values
  for (auto& it : dict_values_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(3));
  }

  // Field 4: array_values
  for (auto& it : array_values_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(4));
  }

  // Field 5: int_value
  if (_has_field_[5]) {
    msg->AppendVarInt(5, int_value_);
  }

  // Field 6: double_value
  if (_has_field_[6]) {
    msg->AppendFixed(6, double_value_);
  }

  // Field 7: bool_value
  if (_has_field_[7]) {
    msg->AppendTinyVarInt(7, bool_value_);
  }

  // Field 8: string_value
  if (_has_field_[8]) {
    msg->AppendString(8, string_value_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}